

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O0

char * parse_vertex(fastObjData *data,char *ptr)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  float local_20;
  uint local_1c;
  float v;
  uint ii;
  char *ptr_local;
  fastObjData *data_local;
  
  local_1c = 0;
  _v = ptr;
  ptr_local = (char *)data;
  do {
    if (2 < local_1c) {
      return _v;
    }
    _v = parse_float(_v,&local_20);
    if ((*(long *)(*(long *)ptr_local + 8) == 0) ||
       (*(uint *)(*(long *)(*(long *)ptr_local + 8) + -4) <=
        *(int *)(*(long *)(*(long *)ptr_local + 8) + -8) + 1U)) {
      pvVar3 = array_realloc(*(void **)(*(long *)ptr_local + 8),1,4);
      *(void **)(*(long *)ptr_local + 8) = pvVar3;
      if (pvVar3 != (void *)0x0) goto LAB_00179216;
    }
    else {
LAB_00179216:
      lVar2 = *(long *)(*(long *)ptr_local + 8);
      uVar1 = *(uint *)(*(long *)(*(long *)ptr_local + 8) + -8);
      *(uint *)(*(long *)(*(long *)ptr_local + 8) + -8) = uVar1 + 1;
      *(float *)(lVar2 + (ulong)uVar1 * 4) = local_20;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static
const char* parse_vertex(fastObjData* data, const char* ptr)
{
   unsigned int ii;
   float        v;


   for (ii = 0; ii < 3; ii++)
   {
       ptr = parse_float(ptr, &v);
       array_push(data->mesh->positions, v);
   }

   return ptr;
}